

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::Trans4x4WHT_MemCheck_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::Trans4x4WHT_MemCheck_Test> *this)

{
  Trans4x4WHT_MemCheck_Test *this_00;
  long in_RDI;
  Test *local_28;
  
  WithParamInterface<std::tuple<void_(*)(const_short_*,_int_*,_int),_void_(*)(const_int_*,_unsigned_char_*,_int),_unsigned_char,_aom_bit_depth,_int,_void_(*)(const_short_*,_int_*,_int)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Trans4x4WHT_MemCheck_Test *)operator_new(0x78);
  anon_unknown.dwarf_124c0ed::Trans4x4WHT_MemCheck_Test::Trans4x4WHT_MemCheck_Test(this_00);
  local_28 = (Test *)0x0;
  if (this_00 != (Trans4x4WHT_MemCheck_Test *)0x0) {
    local_28 = &(this_00->super_Trans4x4WHT).
                super_TestWithParam<std::tuple<void_(*)(const_short_*,_int_*,_int),_void_(*)(const_int_*,_unsigned_char_*,_int),_unsigned_char,_aom_bit_depth,_int,_void_(*)(const_short_*,_int_*,_int)>_>
                .super_Test;
  }
  return local_28;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }